

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr_tree.cpp
# Opt level: O3

expr_node * __thiscall expr_tree::arctanDeriv(expr_tree *this,expr_node *node)

{
  expr_node *peVar1;
  expr_node *peVar2;
  expr_node *peVar3;
  expr_value local_30;
  expr_value local_28;
  
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_28,5);
  peVar2 = Copy(node->right);
  peVar3 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_30,2);
  expr_node::expr_node(peVar3,'\x01',&local_30);
  expr_node::expr_node(peVar1,'\x05',&local_28,(expr_node *)0x0,peVar2,peVar3);
  Link(peVar1,peVar1->left,peVar1->right);
  peVar2 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_28,1);
  peVar3 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_30,1);
  expr_node::expr_node(peVar3,'\x01',&local_30);
  expr_node::expr_node(peVar2,'\x05',&local_28,(expr_node *)0x0,peVar3,peVar1);
  Link(peVar2,peVar2->left,peVar2->right);
  peVar1 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_28,4);
  peVar3 = (expr_node *)operator_new(0x28);
  expr_value::expr_value(&local_30,1);
  expr_node::expr_node(peVar3,'\x01',&local_30);
  expr_node::expr_node(peVar1,'\x05',&local_28,(expr_node *)0x0,peVar3,peVar2);
  Link(peVar1,peVar1->left,peVar1->right);
  return peVar1;
}

Assistant:

expr_node* expr_tree::arctanDeriv(const expr_node* node)
{
    auto square = new expr_node(OP, (long)PWR, nullptr, Copy(node->right), new expr_node(INT, (long)2));
    Link(square, square->left, square->right);
    auto sum = new expr_node(OP, (long)ADD, nullptr, new expr_node(INT, (long)1), square);
    Link(sum, sum->left, sum->right);
    auto frac = new expr_node(OP, (long)DIV, nullptr, new expr_node(INT, (long)1), sum);
    Link(frac, frac->left, frac->right);
    return frac;
}